

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O2

void __thiscall
MultiAgentDecisionProcess::~MultiAgentDecisionProcess(MultiAgentDecisionProcess *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x40)) = vtt[1];
  (this->_m_problemFile)._M_string_length = 0;
  *(this->_m_problemFile)._M_dataplus._M_p = '\0';
  std::__cxx11::string::~string((string *)&this->_m_unixName);
  std::__cxx11::string::~string((string *)&this->_m_problemFile);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&this->_m_allAgentsScope);
  std::vector<Agent,_std::allocator<Agent>_>::~vector(&this->_m_agents);
  NamedDescribedEntity::~NamedDescribedEntity(&this->_m_name);
  return;
}

Assistant:

MultiAgentDecisionProcess::~MultiAgentDecisionProcess()
{
    _m_problemFile.clear();
}